

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<const_kj::WritableFileMapping,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskFile::mmapWritable(DiskFile *this,uint64_t offset,uint64_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  uint64_t in_RCX;
  WritableFileMapping *extraout_RDX;
  WritableFileMapping *extraout_RDX_00;
  WritableFileMapping *pWVar3;
  MmapRange MVar4;
  Own<const_kj::WritableFileMapping,_std::nullptr_t> OVar5;
  Fault f;
  Fault local_30;
  
  if (in_RCX == 0) {
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = &PTR_get_00290648;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::
          instance;
    *(undefined8 **)&this->super_DiskHandle = puVar2;
    pWVar3 = extraout_RDX_00;
  }
  else {
    MVar4 = getMmapRange(size,in_RCX);
    pvVar1 = mmap64((void *)0x0,MVar4.size,3,1,*(int *)(offset + 8),MVar4.offset);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      __errno_location();
      local_30.exception = (Exception *)0x0;
      kj::_::Debug::Fault::init
                (&local_30,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_30);
    }
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = &PTR_get_00290648;
    puVar2[1] = (long)pvVar1 + (size - MVar4.offset);
    puVar2[2] = in_RCX;
    puVar2[3] = &(anonymous_namespace)::mmapDisposer;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::
          instance;
    *(undefined8 **)&this->super_DiskHandle = puVar2;
    pWVar3 = extraout_RDX;
  }
  OVar5.ptr = pWVar3;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    return DiskHandle::mmapWritable(offset, size);
  }